

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::NamespaceScope::addPrefix(NamespaceScope *this,XMLCh *prefixToAdd,uint uriId)

{
  StackElem *toExpand;
  uint uVar1;
  EmptyStackException *this_00;
  uint local_40;
  uint mapIndex;
  uint prefId;
  StackElem *curRow;
  uint uriId_local;
  XMLCh *prefixToAdd_local;
  NamespaceScope *this_local;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/NamespaceScope.cpp"
               ,0x9e,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,EmptyStackException::~EmptyStackException);
  }
  toExpand = this->fStack[this->fStackTop - 1];
  uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  local_40 = 0;
  while( true ) {
    if (toExpand->fMapCount <= local_40) {
      if (toExpand->fMapCount == toExpand->fMapCapacity) {
        expandMap(this,toExpand);
      }
      toExpand->fMap[toExpand->fMapCount].fPrefId = uVar1;
      toExpand->fMap[toExpand->fMapCount].fURIId = uriId;
      toExpand->fMapCount = toExpand->fMapCount + 1;
      return;
    }
    if (toExpand->fMap[local_40].fPrefId == uVar1) break;
    local_40 = local_40 + 1;
  }
  toExpand->fMap[local_40].fURIId = uriId;
  return;
}

Assistant:

void NamespaceScope::addPrefix(const XMLCh* const prefixToAdd,
                               const unsigned int uriId) {

    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    // Search the map at this level for the passed prefix
    for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
    {
        if (curRow->fMap[mapIndex].fPrefId == prefId)
        {
            curRow->fMap[mapIndex].fURIId = uriId;
            return;
        }
    }

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix.
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}